

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O0

char * alignof_type(char *type,size_t *align)

{
  size_t sVar1;
  char *pcVar2;
  size_t local_40;
  size_t ignored;
  char *t_2;
  char *t_1;
  char *t;
  size_t *align_local;
  char *type_local;
  
  t = (char *)align;
  align_local = (size_t *)type;
  ignored = (size_t)objc_skip_type_qualifiers(type);
  align_local = (size_t *)ignored;
  switch((char)*(size_t *)ignored) {
  case '#':
    sVar1 = max(0x40,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  default:
    abort();
  case '(':
    t_2 = (char *)ignored;
    parse_union(&t_2,alignof_type,t);
    type_local = t_2;
    break;
  case '*':
    sVar1 = max(0x40,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case ':':
    sVar1 = max(0x40,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case '?':
  case 'v':
    type_local = (char *)(ignored + 1);
    break;
  case '@':
    sVar1 = max(0x40,*(size_t *)t);
    *(size_t *)t = sVar1;
    pcVar2 = skip_object_extended_qualifiers((char *)align_local);
    type_local = pcVar2 + 1;
    break;
  case 'B':
    sVar1 = max(8,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'C':
    sVar1 = max(8,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'D':
    sVar1 = max(0x80,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'I':
    sVar1 = max(0x20,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'L':
    sVar1 = max(0x40,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'Q':
    sVar1 = max(0x40,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'S':
    sVar1 = max(0x10,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case '[':
    parse_array((char **)&ignored,alignof_type,&t);
    type_local = (char *)ignored;
    break;
  case '^':
    sVar1 = max(0x40,*(size_t *)t);
    *(size_t *)t = sVar1;
    local_40 = 0;
    type_local = alignof_type((char *)((long)align_local + 1),&local_40);
    break;
  case 'b':
    align_local = (size_t *)(ignored + 1);
    strtol((char *)align_local,(char **)&align_local,10);
    align_local = (size_t *)alignof_type((char *)align_local,(size_t *)t);
    strtol((char *)align_local,(char **)&align_local,10);
    type_local = (char *)align_local;
    break;
  case 'c':
    sVar1 = max(8,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'd':
    sVar1 = max(0x40,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'f':
    sVar1 = max(0x20,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'i':
    sVar1 = max(0x20,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'j':
    align_local = (size_t *)(ignored + 1);
    switch(*(char *)align_local) {
    case 'C':
      sVar1 = max(8,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 'D':
      sVar1 = max(0x80,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    default:
      goto switchD_0011bcc8_caseD_7b;
    case 'I':
      sVar1 = max(0x20,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 'L':
      sVar1 = max(0x40,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 'Q':
      sVar1 = max(0x40,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 'S':
      sVar1 = max(0x10,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 'c':
      sVar1 = max(8,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 'd':
      sVar1 = max(0x40,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 'f':
      sVar1 = max(0x20,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 'i':
      sVar1 = max(0x20,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 'l':
      sVar1 = max(0x40,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 'q':
      sVar1 = max(0x40,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
      break;
    case 's':
      sVar1 = max(0x10,*(size_t *)t);
      *(size_t *)t = sVar1;
      type_local = (char *)((long)align_local + 1);
    }
    break;
  case 'l':
    sVar1 = max(0x40,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 'q':
    sVar1 = max(0x40,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case 's':
    sVar1 = max(0x10,*(size_t *)t);
    *(size_t *)t = sVar1;
    type_local = (char *)((long)align_local + 1);
    break;
  case '{':
switchD_0011bcc8_caseD_7b:
    t_1 = (char *)align_local;
    parse_struct(&t_1,alignof_type,t);
    type_local = t_1;
  }
  return type_local;
}

Assistant:

static const char *alignof_type(const char *type, size_t *align)
{
	type = objc_skip_type_qualifiers(type);
	switch (*type)
	{
		// For all primitive types, we return the maximum of the new alignment
		// and the old one
#define APPLY_TYPE(typeName, name, capitalizedName, encodingChar) \
		case encodingChar:\
		{\
			*align = max((alignof(typeName) * 8), *align);\
			return type + 1;\
		}
#define NON_INTEGER_TYPES 1
#define SKIP_ID 1
#include "type_encoding_cases.h"
		case '@':
		{
			*align = max((alignof(id) * 8), *align);\
			return skip_object_extended_qualifiers(type) + 1;
		}
		case '?':
		case 'v': return type+1;
		case 'j':
		{
			type++;
			switch (*type)
			{
#define APPLY_TYPE(typeName, name, capitalizedName, encodingChar) \
		case encodingChar:\
		{\
			*align = max((alignof(_Complex typeName) * 8), *align);\
			return type + 1;\
		}
#include "type_encoding_cases.h"
			}
		}
		case '{':
		{
			const char *t = type;
			parse_struct(&t, (type_parser)alignof_type, align);
			return t;
		}
		case '(':
		{
			const char *t = type;
			parse_union(&t, (type_parser)alignof_type, align);
			return t;
		}
		case '[':
		{
			const char *t = type;
			parse_array(&t, (type_parser)alignof_type, &align);
			return t;
		}
		case 'b':
		{
			// Consume the b
			type++;
			// Ignore the offset
			strtol(type, (char**)&type, 10);
			// Alignment of a bitfield is the alignment of the type that
			// contains it
			type = alignof_type(type, align);
			// Ignore the number of bits
			strtol(type, (char**)&type, 10);
			return type;
		}
		case '^':
		{
			*align = max((alignof(void*) * 8), *align);
			// All pointers look the same to me.
			size_t ignored = 0;
			// Skip the definition of the pointeee type.
			return alignof_type(type+1, &ignored);
		}
	}
	abort();
	return NULL;
}